

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool __thiscall
frozen::basic_string<char>::operator==(basic_string<char> *this,basic_string<char> other)

{
  ulong local_30;
  size_t i;
  basic_string<char> *this_local;
  basic_string<char> other_local;
  
  if (this->size_ == other.size_) {
    for (local_30 = 0; local_30 < this->size_; local_30 = local_30 + 1) {
      if (this->data_[local_30] != other.data_[local_30]) {
        return false;
      }
    }
    other_local.size_._7_1_ = true;
  }
  else {
    other_local.size_._7_1_ = false;
  }
  return other_local.size_._7_1_;
}

Assistant:

constexpr bool operator==(basic_string other) const {
    if (size_ != other.size_)
      return false;
    for (std::size_t i = 0; i < size_; ++i)
      if (data_[i] != other.data_[i])
        return false;
    return true;
  }